

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

_Bool openssh_new_write(Filename *filename,ssh2_userkey *ukey,char *passphrase)

{
  uchar val;
  uint32_t uVar1;
  ssh_key *key_00;
  strbuf *buf_o;
  strbuf *buf_o_00;
  strbuf *sb;
  strbuf *psVar2;
  char *str;
  ssh_cipher *c;
  FILE *__stream;
  ptrlen pVar3;
  ptrlen salt;
  ssh_cipher *cipher;
  uchar keybuf [48];
  uint8_t checkint_buf [4];
  strbuf *cpblob;
  strbuf *substr;
  ssh_key *key;
  FILE *fp;
  undefined1 local_58 [4];
  int bcrypt_rounds;
  uchar bcrypt_salt [16];
  _Bool ret;
  uint checkint;
  int padvalue;
  strbuf *cblob;
  strbuf *privblob;
  strbuf *pubblob;
  char *passphrase_local;
  ssh2_userkey *ukey_local;
  Filename *filename_local;
  
  bcrypt_salt[0xf] = '\0';
  key_00 = ssh_key_base_key(ukey->key);
  buf_o = strbuf_new();
  ssh_key_public_blob(key_00,buf_o->binarysink_);
  buf_o_00 = strbuf_new_nm();
  ssh_key_openssh_blob(key_00,buf_o_00->binarysink_);
  sb = strbuf_new_nm();
  BinarySink_put_asciz(sb->binarysink_,"openssh-key-v1");
  if (passphrase == (char *)0x0) {
    memset(local_58,0,0x10);
    BinarySink_put_stringz(sb->binarysink_,"none");
    BinarySink_put_stringz(sb->binarysink_,"none");
    BinarySink_put_stringz(sb->binarysink_,"");
  }
  else {
    random_read(local_58,0x10);
    BinarySink_put_stringz(sb->binarysink_,"aes256-ctr");
    BinarySink_put_stringz(sb->binarysink_,"bcrypt");
    psVar2 = strbuf_new_nm();
    BinarySink_put_string(psVar2->binarysink_,local_58,0x10);
    BinarySink_put_uint32(psVar2->binarysink_,0x10);
    BinarySink_put_stringsb(sb->binarysink_,psVar2);
  }
  BinarySink_put_uint32(sb->binarysink_,1);
  BinarySink_put_string(sb->binarysink_,buf_o->s,buf_o->len);
  psVar2 = strbuf_new_nm();
  random_read(keybuf + 0x2c,4);
  uVar1 = GET_32BIT_MSB_FIRST(keybuf + 0x2c);
  BinarySink_put_uint32(psVar2->binarysink_,(ulong)uVar1);
  BinarySink_put_uint32(psVar2->binarysink_,(ulong)uVar1);
  str = ssh_key_ssh_id(key_00);
  BinarySink_put_stringz(psVar2->binarysink_,str);
  BinarySink_put_data(psVar2->binarysink_,buf_o_00->s,buf_o_00->len);
  BinarySink_put_stringz(psVar2->binarysink_,ukey->comment);
  val = '\x01';
  do {
    BinarySink_put_byte(psVar2->binarysink_,val);
    val = val + '\x01';
  } while ((psVar2->len & 0xf) != 0);
  if (passphrase != (char *)0x0) {
    pVar3 = ptrlen_from_asciz(passphrase);
    salt = make_ptrlen(local_58,0x10);
    openssh_bcrypt(pVar3,salt,0x10,(uchar *)&cipher,0x30);
    c = ssh_cipher_new(&ssh_aes256_sdctr);
    ssh_cipher_setkey(c,&cipher);
    ssh_cipher_setiv(c,keybuf + 0x18);
    ssh_cipher_encrypt(c,psVar2->u,(int)psVar2->len);
    ssh_cipher_free(c);
    smemclr(&cipher,0x30);
  }
  BinarySink_put_stringsb(sb->binarysink_,psVar2);
  __stream = (FILE *)f_open(filename,"wb",true);
  if (__stream != (FILE *)0x0) {
    fputs("-----BEGIN OPENSSH PRIVATE KEY-----\n",__stream);
    pVar3 = ptrlen_from_strbuf(sb);
    base64_encode_fp((FILE *)__stream,pVar3,0x40);
    fputs("-----END OPENSSH PRIVATE KEY-----\n",__stream);
    fclose(__stream);
    bcrypt_salt[0xf] = '\x01';
  }
  if (sb != (strbuf *)0x0) {
    strbuf_free(sb);
  }
  if (buf_o_00 != (strbuf *)0x0) {
    strbuf_free(buf_o_00);
  }
  if (buf_o != (strbuf *)0x0) {
    strbuf_free(buf_o);
  }
  return (_Bool)(bcrypt_salt[0xf] & 1);
}

Assistant:

static bool openssh_new_write(
    const Filename *filename, ssh2_userkey *ukey, const char *passphrase)
{
    strbuf *pubblob, *privblob, *cblob;
    int padvalue;
    unsigned checkint;
    bool ret = false;
    unsigned char bcrypt_salt[16];
    const int bcrypt_rounds = 16;
    FILE *fp;

    /* OpenSSH's private key files never contain a certificate, so
     * revert to the underlying base key if necessary */
    ssh_key *key = ssh_key_base_key(ukey->key);

    /*
     * Fetch the key blobs and find out the lengths of things.
     */
    pubblob = strbuf_new();
    ssh_key_public_blob(key, BinarySink_UPCAST(pubblob));
    privblob = strbuf_new_nm();
    ssh_key_openssh_blob(key, BinarySink_UPCAST(privblob));

    /*
     * Construct the cleartext version of the blob.
     */
    cblob = strbuf_new_nm();

    /* Magic number. */
    put_asciz(cblob, "openssh-key-v1");

    /* Cipher and kdf names, and kdf options. */
    if (!passphrase) {
        memset(bcrypt_salt, 0, sizeof(bcrypt_salt)); /* prevent warnings */
        put_stringz(cblob, "none");
        put_stringz(cblob, "none");
        put_stringz(cblob, "");
    } else {
        strbuf *substr;

        random_read(bcrypt_salt, sizeof(bcrypt_salt));
        put_stringz(cblob, "aes256-ctr");
        put_stringz(cblob, "bcrypt");
        substr = strbuf_new_nm();
        put_string(substr, bcrypt_salt, sizeof(bcrypt_salt));
        put_uint32(substr, bcrypt_rounds);
        put_stringsb(cblob, substr);
    }

    /* Number of keys. */
    put_uint32(cblob, 1);

    /* Public blob. */
    put_string(cblob, pubblob->s, pubblob->len);

    /* Private section. */
    {
        strbuf *cpblob = strbuf_new_nm();

        /* checkint. */
        uint8_t checkint_buf[4];
        random_read(checkint_buf, 4);
        checkint = GET_32BIT_MSB_FIRST(checkint_buf);
        put_uint32(cpblob, checkint);
        put_uint32(cpblob, checkint);

        /* Private key. The main private blob goes inline, with no string
         * wrapper. */
        put_stringz(cpblob, ssh_key_ssh_id(key));
        put_data(cpblob, privblob->s, privblob->len);

        /* Comment. */
        put_stringz(cpblob, ukey->comment);

        /* Pad out the encrypted section. */
        padvalue = 1;
        do {
            put_byte(cpblob, padvalue++);
        } while (cpblob->len & 15);

        if (passphrase) {
            /*
             * Encrypt the private section. We need 48 bytes of key
             * material: 32 bytes AES key + 16 bytes iv.
             */
            unsigned char keybuf[48];
            ssh_cipher *cipher;

            openssh_bcrypt(ptrlen_from_asciz(passphrase),
                           make_ptrlen(bcrypt_salt, sizeof(bcrypt_salt)),
                           bcrypt_rounds, keybuf, sizeof(keybuf));

            cipher = ssh_cipher_new(&ssh_aes256_sdctr);
            ssh_cipher_setkey(cipher, keybuf);
            ssh_cipher_setiv(cipher, keybuf + 32);
            ssh_cipher_encrypt(cipher, cpblob->u, cpblob->len);
            ssh_cipher_free(cipher);

            smemclr(keybuf, sizeof(keybuf));
        }

        put_stringsb(cblob, cpblob);
    }

    /*
     * And save it. We'll use Unix line endings just in case it's
     * subsequently transferred in binary mode.
     */
    fp = f_open(filename, "wb", true);      /* ensure Unix line endings */
    if (!fp)
        goto error;
    fputs("-----BEGIN OPENSSH PRIVATE KEY-----\n", fp);
    base64_encode_fp(fp, ptrlen_from_strbuf(cblob), 64);
    fputs("-----END OPENSSH PRIVATE KEY-----\n", fp);
    fclose(fp);
    ret = true;

    error:
    if (cblob)
        strbuf_free(cblob);
    if (privblob)
        strbuf_free(privblob);
    if (pubblob)
        strbuf_free(pubblob);
    return ret;
}